

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int mvsad_err_cost(FULLPEL_MV *mv,FULLPEL_MV *ref_mv,int *mvjcost,int **mvcost,int sad_per_bit,
                  MV_COST_TYPE mv_cost_type)

{
  short sVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  short *in_RSI;
  short *in_RDI;
  int in_R8D;
  byte in_R9B;
  MV diff;
  undefined6 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffd2;
  uint local_4;
  
  sVar1 = (*in_RDI - *in_RSI) * 8;
  sVar2 = (in_RDI[1] - in_RSI[1]) * 8;
  switch((int **)(ulong)in_R9B) {
  case (int **)0x0:
    iVar3 = mv_cost((MV *)CONCAT44(in_R8D,CONCAT13(in_R9B,CONCAT12(in_stack_ffffffffffffffd2,sVar2))
                                  ),(int *)CONCAT26(sVar1,in_stack_ffffffffffffffc8),
                    (int **)(ulong)in_R9B);
    local_4 = iVar3 * in_R8D + 0x100U >> 9;
    break;
  case (int **)0x1:
    iVar3 = (int)sVar1;
    if (iVar3 < 1) {
      iVar3 = -iVar3;
    }
    iVar4 = (int)sVar2;
    if (iVar4 < 1) {
      iVar4 = -iVar4;
    }
    local_4 = (iVar3 + iVar4) * 0x20 >> 3;
    break;
  case (int **)0x2:
    iVar3 = (int)sVar1;
    if (iVar3 < 1) {
      iVar3 = -iVar3;
    }
    iVar4 = (int)sVar2;
    if (iVar4 < 1) {
      iVar4 = -iVar4;
    }
    local_4 = (iVar3 + iVar4) * 0xf >> 3;
    break;
  case (int **)0x3:
    iVar3 = (int)sVar1;
    if (iVar3 < 1) {
      iVar3 = -iVar3;
    }
    iVar4 = (int)sVar2;
    if (iVar4 < 1) {
      iVar4 = -iVar4;
    }
    local_4 = (iVar3 + iVar4) * 8 >> 3;
    break;
  case (int **)0x4:
    local_4 = 0;
    break;
  default:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int mvsad_err_cost(const FULLPEL_MV *mv, const FULLPEL_MV *ref_mv,
                                 const int *mvjcost, const int *const mvcost[2],
                                 int sad_per_bit, MV_COST_TYPE mv_cost_type) {
  const MV diff = { GET_MV_SUBPEL(mv->row - ref_mv->row),
                    GET_MV_SUBPEL(mv->col - ref_mv->col) };

  switch (mv_cost_type) {
    case MV_COST_ENTROPY:
      return ROUND_POWER_OF_TWO(
          (unsigned)mv_cost(&diff, mvjcost, CONVERT_TO_CONST_MVCOST(mvcost)) *
              sad_per_bit,
          AV1_PROB_COST_SHIFT);
    case MV_COST_L1_LOWRES:
      return (SAD_LAMBDA_LOWRES * (abs(diff.row) + abs(diff.col))) >> 3;
    case MV_COST_L1_MIDRES:
      return (SAD_LAMBDA_MIDRES * (abs(diff.row) + abs(diff.col))) >> 3;
    case MV_COST_L1_HDRES:
      return (SAD_LAMBDA_HDRES * (abs(diff.row) + abs(diff.col))) >> 3;
    case MV_COST_NONE: return 0;
    default: assert(0 && "Invalid rd_cost_type"); return 0;
  }
}